

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

bool deqp::gles31::Functional::shaderContainsIOBlocks(Shader *shader)

{
  pointer pIVar1;
  Storage *pSVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  pIVar1 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (int)((long)(shader->m_defaultBlock).interfaceBlocks.
                      super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4) * 0x38e38e39;
  if ((int)uVar3 < 1) {
    bVar6 = false;
  }
  else {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    pSVar2 = &pIVar1->storage;
    bVar6 = true;
    uVar5 = 1;
    do {
      if ((*pSVar2 < STORAGE_LAST) && ((99U >> (*pSVar2 & 0x1f) & 1) != 0)) {
        return bVar6;
      }
      bVar6 = uVar5 < uVar4;
      pSVar2 = pSVar2 + 0x24;
      bVar7 = uVar5 != uVar4;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  return bVar6;
}

Assistant:

bool shaderContainsIOBlocks (const ProgramInterfaceDefinition::Shader* shader)
{
	for (int ndx = 0; ndx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++ndx)
	{
		const glu::Storage storage = shader->getDefaultBlock().interfaceBlocks[ndx].storage;
		if (storage == glu::STORAGE_IN			||
			storage == glu::STORAGE_OUT			||
			storage == glu::STORAGE_PATCH_IN	||
			storage == glu::STORAGE_PATCH_OUT)
		{
			return true;
		}
	}
	return false;
}